

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_alloc_src_diff_buf(AV1Common *cm,macroblock *mb)

{
  uint8_t uVar1;
  int16_t *piVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = cm->seq_params->monochrome;
  uVar4 = 0;
  while( true ) {
    bVar3 = 0;
    if (uVar4 != 0) {
      bVar3 = (char)cm->seq_params->subsampling_y + (char)cm->seq_params->subsampling_x;
    }
    piVar2 = (int16_t *)aom_memalign(0x20,(ulong)((0x4000U >> (bVar3 & 0x1f)) * 2));
    mb->plane[0].src_diff = piVar2;
    if (piVar2 == (int16_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mb->plane[plane].src_diff");
    }
    if (uVar1 != '\0') break;
    mb = (macroblock *)(mb->plane + 1);
    bVar5 = 1 < uVar4;
    uVar4 = uVar4 + 1;
    if (bVar5) {
      return;
    }
  }
  return;
}

Assistant:

void av1_alloc_src_diff_buf(const struct AV1Common *cm, struct macroblock *mb) {
  const int num_planes = av1_num_planes(cm);
#ifndef NDEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    assert(!mb->plane[plane].src_diff);
  }
#endif
  for (int plane = 0; plane < num_planes; ++plane) {
    const int subsampling_xy =
        plane ? cm->seq_params->subsampling_x + cm->seq_params->subsampling_y
              : 0;
    const int sb_size = MAX_SB_SQUARE >> subsampling_xy;
    CHECK_MEM_ERROR(cm, mb->plane[plane].src_diff,
                    (int16_t *)aom_memalign(
                        32, sizeof(*mb->plane[plane].src_diff) * sb_size));
  }
}